

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

void Extra_ThreshCheckTest(void)

{
  int Chow0;
  byte bVar1;
  long lVar2;
  ulong uVar3;
  word t;
  int Weights [16];
  int Chow [16];
  word local_c0;
  int local_b8 [16];
  int local_78 [18];
  
  local_c0 = 0xa888888088808880;
  lVar2 = 0;
  uVar3 = 0;
  do {
    bVar1 = (byte)(1 << ((byte)uVar3 & 0x1f));
    printf("%d %d %d\n",uVar3 & 0xffffffff,
           (ulong)((*(ulong *)((long)s_Truths6Neg + lVar2) &
                   ~(0xa888888088808880U >> (bVar1 & 0x3f)) & 0xa888888088808880) == 0),
           (ulong)((*(ulong *)((long)s_Truths6 + lVar2) &
                   ~(-0x5777777f777f7780 << (bVar1 & 0x3f)) & 0xa888888088808880U) == 0));
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 8;
  } while (uVar3 != 6);
  Extra_ThreshComputeChow(&local_c0,6,local_78);
  Chow0 = Extra_ThreshCheck(&local_c0,6,local_b8);
  if (Chow0 == 0) {
    puts("No threshold");
  }
  else {
    Extra_ThreshPrintChow(Chow0,local_b8,6);
  }
  return;
}

Assistant:

void Extra_ThreshCheckTest() {
    int nVars = 6;
    int T, Chow0, Chow[16], Weights[16];
//    word t =  s_Truths6[0] & s_Truths6[1] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4];
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[4]);
//    word t = (s_Truths6[2] & s_Truths6[1])
//            | (s_Truths6[2] & s_Truths6[0] & s_Truths6[3])
//            | (s_Truths6[2] & s_Truths6[0] & ~s_Truths6[4]);
    word t = (s_Truths6[0] & s_Truths6[1] & s_Truths6[2])| (s_Truths6[0] & s_Truths6[1] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]);
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2]) | (s_Truths6[0] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]) | 
//        (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[5]);
    int i;
    assert(nVars <= 8);
    for (i = 0; i < nVars; i++)
        printf("%d %d %d\n", i, Abc_TtPosVar(&t, nVars, i),
                Abc_TtNegVar(&t, nVars, i));
//    word t = s_Truths6[0] & s_Truths6[1] & s_Truths6[2];
    Chow0 = Extra_ThreshComputeChow(&t, nVars, Chow);
    if ((T = Extra_ThreshCheck(&t, nVars, Weights)))
        Extra_ThreshPrintChow(T, Weights, nVars);
    else
        printf("No threshold\n");
}